

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

void * duckdb_yyjson::pool_malloc(void *ctx_ptr,usize size)

{
  ulong uVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  pool_ctx *ctx;
  ulong uVar7;
  
  if (size < *ctx_ptr) {
    puVar2 = *(ulong **)((long)ctx_ptr + 8);
    if (puVar2 != (ulong *)0x0) {
      uVar5 = size + 0xf & 0xfffffffffffffff0;
      uVar1 = uVar5 + 0x10;
      uVar7 = *puVar2;
      if (uVar7 < uVar1) {
        do {
          puVar4 = puVar2;
          puVar2 = (ulong *)puVar4[1];
          if (puVar2 == (ulong *)0x0) {
            return (void *)0x0;
          }
          uVar7 = *puVar2;
        } while (uVar7 < uVar1);
      }
      else {
        puVar4 = (ulong *)0x0;
      }
      if (uVar7 < uVar5 + 0x30) {
        uVar6 = puVar2[1];
      }
      else {
        uVar6 = (long)puVar2 + uVar1;
        *(ulong *)((long)puVar2 + uVar1) = uVar7 - uVar1;
        *(ulong *)((long)puVar2 + uVar5 + 0x18) = puVar2[1];
        *puVar2 = uVar1;
      }
      puVar3 = puVar4 + 1;
      if (puVar4 == (ulong *)0x0) {
        puVar3 = (ulong *)((long)ctx_ptr + 8);
      }
      *puVar3 = uVar6;
      return puVar2 + 2;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *pool_malloc(void *ctx_ptr, usize size) {
    /* assert(size != 0) */
    pool_ctx *ctx = (pool_ctx *)ctx_ptr;
    pool_chunk *next, *prev = NULL, *cur = ctx->free_list;

    if (unlikely(size >= ctx->size)) return NULL;
    pool_size_align(&size);

    while (cur) {
        if (cur->size < size) {
            /* not enough space, try next chunk */
            prev = cur;
            cur = cur->next;
            continue;
        }
        if (cur->size >= size + sizeof(pool_chunk) * 2) {
            /* too much space, split this chunk */
            next = (pool_chunk *)(void *)((u8 *)cur + size);
            next->size = cur->size - size;
            next->next = cur->next;
            cur->size = size;
        } else {
            /* just enough space, use whole chunk */
            next = cur->next;
        }
        if (prev) prev->next = next;
        else ctx->free_list = next;
        return (void *)(cur + 1);
    }
    return NULL;
}